

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

void __thiscall TURBOLINECOUNT::CLineCount::CLineCount(CLineCount *this,PARAMETERS *parameters)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  PARAMETERS *ctx;
  
  (this->m_lasterrorstring)._M_dataplus._M_p = (pointer)&(this->m_lasterrorstring).field_2;
  (this->m_lasterrorstring)._M_string_length = 0;
  (this->m_lasterrorstring).field_2._M_local_buf[0] = '\0';
  (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_threads).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ctx = parameters;
  lVar2 = sysconf(0x54);
  lVar3 = sysconf(0x1e);
  (this->m_parameters).threadcount = (int)lVar2;
  (this->m_parameters).buffersize = 0x100000;
  if (parameters != (PARAMETERS *)0x0) {
    uVar1 = parameters->buffersize;
    if (uVar1 != 0xffffffffffffffff) {
      ctx = (PARAMETERS *)(long)(int)lVar3;
      (this->m_parameters).buffersize = ((long)ctx - uVar1 % (ulong)ctx) % (ulong)ctx + uVar1;
    }
    if (parameters->threadcount != -1) {
      (this->m_parameters).threadcount = parameters->threadcount;
    }
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

CLineCount::CLineCount(PARAMETERS *parameters)
{

	// Set line count parameter defaults
	int cpucount;
	int allocationgranularity;
#if defined(_WIN32) || defined(__cygwin__) || defined(__MIN)
	SYSTEM_INFO sysinfo;
	GetSystemInfo(&sysinfo);
	cpucount = sysinfo.dwNumberOfProcessors;
	allocationgranularity = sysinfo.dwAllocationGranularity;
//#elif defined(__linux__)
#elif TLC_COMPATIBLE_UNIX
	cpucount = sysconf(_SC_NPROCESSORS_ONLN);
	allocationgranularity = sysconf(_SC_PAGESIZE);
//#elif (defined (__APPLE__) && defined (__MACH__))
//	mmsize_t count_len = sizeof(cpucount);
//	sysctlbyname("hw.logicalcpu", &cpucount, &count_len, NULL, 0);
//#else
//	cpucount = 1;
#endif
	m_parameters.threadcount = cpucount;
	m_parameters.buffersize = (1024 * 1024);
	
	// Override defaults if specified
	if (parameters)
	{
		if (parameters->buffersize != -1)
		{
			m_parameters.buffersize = parameters->buffersize;
			m_parameters.buffersize += (allocationgranularity - (m_parameters.buffersize % allocationgranularity)) % allocationgranularity;
		}
		if (parameters->threadcount != -1)
		{
			m_parameters.threadcount = parameters->threadcount;
		}
	}
	
	init();
}